

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::walk
          (Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_> *this,Expression **root)

{
  size_t sVar1;
  pointer pTVar2;
  pointer pTVar3;
  TaskFunc p_Var4;
  Expression **ppEVar5;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::walk(Expression *&) [SubType = Reindexer, VisitorType = wasm::Visitor<Reindexer>]"
                 );
  }
  pushTask(this,PostWalker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::scan,root);
  sVar1 = (this->stack).usedFixed;
  pTVar3 = (this->stack).flexible.
           super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->stack).flexible.
           super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pTVar2 - (long)pTVar3 >> 4) + sVar1 != 0) {
    do {
      if (pTVar3 == pTVar2) {
        if (sVar1 == 0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::Task, 10>::back() [T = wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::Task, N = 10]"
                       );
        }
        p_Var4 = (this->stack).fixed._M_elems[sVar1 - 1].func;
        ppEVar5 = (this->stack).fixed._M_elems[sVar1 - 1].currp;
        (this->stack).usedFixed = sVar1 - 1;
      }
      else {
        p_Var4 = pTVar2[-1].func;
        ppEVar5 = pTVar2[-1].currp;
        (this->stack).flexible.
        super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar2 + -1;
      }
      this->replacep = ppEVar5;
      if (*ppEVar5 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::walk(Expression *&) [SubType = Reindexer, VisitorType = wasm::Visitor<Reindexer>]"
                     );
      }
      (*p_Var4)((Reindexer *)(this[-1].stack.fixed._M_elems + 7),ppEVar5);
      sVar1 = (this->stack).usedFixed;
      pTVar3 = (this->stack).flexible.
               super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (this->stack).flexible.
               super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (((long)pTVar2 - (long)pTVar3 >> 4) + sVar1 != 0);
  }
  return;
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }